

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase671::run(TestCase671 *this)

{
  PointerBuilder builder_00;
  Builder reader_00;
  Reader reader_01;
  WirePointer *pWVar1;
  char cVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ArrayPtr<const_unsigned_short> value;
  initializer_list<unsigned_short> expected;
  initializer_list<unsigned_short> expected_00;
  Reader reader;
  uint local_33c;
  Fault f_1;
  StructDataBitCount local_318;
  ListElementCount local_2fc;
  Builder root;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_2d0;
  ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_2a8;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_> l;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  reader._reader.segment = (SegmentReader *)0x7801560134001201;
  builder_00.capTable = root._builder.capTable;
  builder_00.segment = root._builder.segment;
  builder_00.pointer = root._builder.pointers;
  value.size_ = 4;
  value.ptr = (unsigned_short *)&reader;
  PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value)
  ;
  reader._reader.segment = (SegmentReader *)&PTR_run_00391700;
  reader._reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&reader);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2a7,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  reader._reader.segment = &(root._builder.segment)->super_SegmentReader;
  reader._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  reader._reader.data = root._builder.pointers;
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            (&l,(Builder *)&reader);
  if (l.builder.elementCount == 4) {
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,0);
    if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ac,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
    }
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,1);
    if (((*reader._reader.data & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ad,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
    }
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,2);
    if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ae,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
    }
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,3);
    if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2af,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
    }
    l.builder.segment = root._builder.segment;
    l.builder.capTable = root._builder.capTable;
    l.builder.ptr = (byte *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_2d0,(Builder *)&l)
    ;
    reader._reader.segment = (SegmentReader *)0x7801560134001201;
    reader_00.builder.capTable = local_2d0.builder.capTable;
    reader_00.builder.segment = local_2d0.builder.segment;
    reader_00.builder.ptr = local_2d0.builder.ptr;
    reader_00.builder.elementCount = local_2d0.builder.elementCount;
    reader_00.builder.step = local_2d0.builder.step;
    reader_00.builder.structDataSize = local_2d0.builder.structDataSize;
    reader_00.builder.structPointerCount = local_2d0.builder.structPointerCount;
    reader_00.builder.elementSize = local_2d0.builder.elementSize;
    reader_00.builder._39_1_ = local_2d0.builder._39_1_;
    expected._M_len = 4;
    expected._M_array = (iterator)&reader;
    checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
              (reader_00,expected);
    StructBuilder::asReader(&root._builder);
    f_1.exception = (Exception *)&PTR_run_00391730;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f_1);
    cVar2 = (char)l.builder.segment;
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
    if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2b7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
    }
    pWVar1 = (WirePointer *)0x0;
    if (reader._reader.pointerCount != 0) {
      pWVar1 = reader._reader.pointers;
    }
    f_1.exception._0_4_ = 0;
    f_1.exception._4_4_ = 0;
    if (reader._reader.pointerCount != 0) {
      f_1.exception._0_4_ = reader._reader.segment._0_4_;
      f_1.exception._4_4_ = reader._reader.segment._4_4_;
    }
    AnyPointer::Reader::
    getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
              ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
                *)&l,(Reader *)&f_1);
    if (l.builder.elementCount != 4) {
      local_33c = 4;
      local_2fc = l.builder.elementCount;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,699,FAILED,"(4u) == (l.size())","4u, l.size()",&local_33c,&local_2fc);
      kj::_::Debug::Fault::fatal(&f_1);
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,0);
    if (((local_318 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,700,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,1);
    if (((local_318 != 0) && (((pWVar1->offsetAndKind).value & 1) != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2bd,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,2);
    if (((local_318 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2be,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
    }
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,3);
    if (((local_318 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2bf,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
    }
    bVar3 = reader._reader.pointerCount != 0;
    l.builder.ptr = (byte *)(WirePointer *)0x0;
    if (bVar3) {
      l.builder.ptr = (byte *)reader._reader.pointers;
    }
    l.builder.elementCount = 0x7fffffff;
    if (bVar3) {
      l.builder.elementCount = reader._reader.nestingLimit;
    }
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    if (bVar3) {
      uVar4 = reader._reader.segment._0_4_;
      uVar5 = reader._reader.segment._4_4_;
      uVar6 = reader._reader.capTable._0_4_;
      uVar7 = reader._reader.capTable._4_4_;
    }
    l.builder.segment = (SegmentBuilder *)CONCAT44(uVar5,uVar4);
    l.builder.capTable = (CapTableBuilder *)CONCAT44(uVar7,uVar6);
    AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_2a8,(Reader *)&l);
    f_1.exception = (Exception *)0x7801560134001201;
    reader_01.reader.capTable = local_2a8.reader.capTable;
    reader_01.reader.segment = local_2a8.reader.segment;
    reader_01.reader.ptr = local_2a8.reader.ptr;
    reader_01.reader.elementCount = local_2a8.reader.elementCount;
    reader_01.reader.step = local_2a8.reader.step;
    reader_01.reader.structDataSize = local_2a8.reader.structDataSize;
    reader_01.reader.structPointerCount = local_2a8.reader.structPointerCount;
    reader_01.reader.elementSize = local_2a8.reader.elementSize;
    reader_01.reader._39_1_ = local_2a8.reader._39_1_;
    reader_01.reader.nestingLimit = local_2a8.reader.nestingLimit;
    reader_01.reader._44_4_ = local_2a8.reader._44_4_;
    expected_00._M_len = 4;
    expected_00._M_array = (iterator)&f_1;
    checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
              (reader_01,expected_00);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  f_1.exception._0_4_ = 4;
  local_33c = l.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&reader,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x2ab,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&f_1,&local_33c);
  kj::_::Debug::Fault::fatal((Fault *)&reader);
}

Assistant:

TEST(Encoding, BitListDowngrade) {
  // NO LONGER SUPPORTED -- We check for exceptions thrown.

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({0x1201u, 0x3400u, 0x5601u, 0x7801u});

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(),
            {0x1201u, 0x3400u, 0x5601u, 0x7801u});

  auto reader = root.asReader();

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(),
            {0x1201u, 0x3400u, 0x5601u, 0x7801u});
}